

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_2::IdentityGeometryShaderTestCase::initPrograms
          (IdentityGeometryShaderTestCase *this,SourceCollections *programCollection)

{
  TessPrimitiveType TVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  string local_528;
  ShaderSource local_508;
  allocator<char> local_4d9;
  string local_4d8;
  ostringstream local_4b8 [8];
  ostringstream src_1;
  allocator<char> local_339;
  string local_338;
  string local_318;
  ShaderSource local_2f8;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  ShaderSource local_260;
  allocator<char> local_231;
  string local_230;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *programCollection_local;
  IdentityGeometryShaderTestCase *this_local;
  
  addVertexAndFragmentShaders(programCollection);
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_190,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_tessellation_shader : require\n");
  poVar4 = std::operator<<(poVar4,"layout(vertices = 4) out;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n"
                          );
  poVar4 = std::operator<<(poVar4,"    float inner0;\n");
  poVar4 = std::operator<<(poVar4,"    float inner1;\n");
  poVar4 = std::operator<<(poVar4,"    float outer0;\n");
  poVar4 = std::operator<<(poVar4,"    float outer1;\n");
  poVar4 = std::operator<<(poVar4,"    float outer2;\n");
  poVar4 = std::operator<<(poVar4,"    float outer3;\n");
  poVar4 = std::operator<<(poVar4,"} sb_levels;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) in  highp vec4 v_vertex_color[];\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) out highp vec4 v_patch_color[];\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,
                           "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "    v_patch_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
                          );
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelInner[0] = sb_levels.inner0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelInner[1] = sb_levels.inner1;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[0] = sb_levels.outer0;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[1] = sb_levels.outer1;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[2] = sb_levels.outer2;\n");
  poVar4 = std::operator<<(poVar4,"    gl_TessLevelOuter[3] = sb_levels.outer3;\n");
  std::operator<<(poVar4,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"tesc",&local_1c1);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar5,&local_1f0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"tese_to_frag",&local_231)
  ;
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_230);
  TVar1 = this->m_primitiveType;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"v_fragment_color",&local_2a1);
  generateTessellationEvaluationShader(&local_280,TVar1,&local_2a0);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_260,&local_280);
  glu::ProgramSources::operator<<(pPVar5,&local_260);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"tese_to_geom",&local_2c9)
  ;
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_2c8);
  TVar1 = this->m_primitiveType;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"v_evaluated_color",&local_339);
  generateTessellationEvaluationShader(&local_318,TVar1,&local_338);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_2f8,&local_318);
  glu::ProgramSources::operator<<(pPVar5,&local_2f8);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::ostringstream::ostringstream(local_4b8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_4b8,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_geometry_shader : require\n");
  poVar4 = std::operator<<(poVar4,"layout(");
  pcVar3 = getGeometryShaderInputPrimitiveTypeShaderName(this->m_primitiveType,false);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,") in;\n");
  poVar4 = std::operator<<(poVar4,"layout(");
  pcVar3 = getGeometryShaderOutputPrimitiveTypeShaderName(this->m_primitiveType,false);
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,", max_vertices=");
  iVar2 = numVerticesPerPrimitive(this->m_primitiveType,false);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,") out;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) in  highp vec4 v_evaluated_color[];\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) out highp vec4 v_fragment_color;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"    for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n");
  poVar4 = std::operator<<(poVar4,"    {\n");
  poVar4 = std::operator<<(poVar4,"        gl_Position = gl_in[ndx].gl_Position;\n");
  poVar4 = std::operator<<(poVar4,"        v_fragment_color = v_evaluated_color[ndx];\n");
  poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
  poVar4 = std::operator<<(poVar4,"    }\n");
  std::operator<<(poVar4,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"geom",&local_4d9);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_4d8);
  std::__cxx11::ostringstream::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_508,&local_528);
  glu::ProgramSources::operator<<(pPVar5,&local_508);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::ostringstream::~ostringstream(local_4b8);
  return;
}

Assistant:

void IdentityGeometryShaderTestCase::initPrograms (vk::SourceCollections& programCollection) const
{
	addVertexAndFragmentShaders(programCollection);

	// Tessellation control
	{
		std::ostringstream src;
		src <<	glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(vertices = 4) out;\n"
			<< "\n"
			<< "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n"
			<< "    float inner0;\n"
			<< "    float inner1;\n"
			<< "    float outer0;\n"
			<< "    float outer1;\n"
			<< "    float outer2;\n"
			<< "    float outer3;\n"
			<< "} sb_levels;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_vertex_color[];\n"
			<< "layout(location = 0) out highp vec4 v_patch_color[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    v_patch_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = sb_levels.inner0;\n"
			<< "    gl_TessLevelInner[1] = sb_levels.inner1;\n"
			<< "    gl_TessLevelOuter[0] = sb_levels.outer0;\n"
			<< "    gl_TessLevelOuter[1] = sb_levels.outer1;\n"
			<< "    gl_TessLevelOuter[2] = sb_levels.outer2;\n"
			<< "    gl_TessLevelOuter[3] = sb_levels.outer3;\n"
			<<	"}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		programCollection.glslSources.add("tese_to_frag")
			<< glu::TessellationEvaluationSource(generateTessellationEvaluationShader(m_primitiveType, "v_fragment_color"));
		programCollection.glslSources.add("tese_to_geom")
			<< glu::TessellationEvaluationSource(generateTessellationEvaluationShader(m_primitiveType, "v_evaluated_color"));
	}

	// Geometry shader
	{
		std::ostringstream	src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(" << getGeometryShaderInputPrimitiveTypeShaderName(m_primitiveType, false) << ") in;\n"
			<< "layout(" << getGeometryShaderOutputPrimitiveTypeShaderName(m_primitiveType, false)
						 << ", max_vertices=" << numVerticesPerPrimitive(m_primitiveType, false) << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec4 v_evaluated_color[];\n"
			<< "layout(location = 0) out highp vec4 v_fragment_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    for (int ndx = 0; ndx < gl_in.length(); ++ndx)\n"
			<< "    {\n"
			<< "        gl_Position = gl_in[ndx].gl_Position;\n"
			<< "        v_fragment_color = v_evaluated_color[ndx];\n"
			<< "        EmitVertex();\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}
}